

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::forward
          (DeconvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  int *piVar15;
  size_t sVar16;
  void *pvVar17;
  undefined4 *puVar18;
  Layer *pLVar19;
  float *pfVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  bool bVar27;
  Mat *pMVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  float *pfVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  undefined1 (*pauVar46) [32];
  undefined1 (*pauVar47) [16];
  ulong uVar48;
  ulong uVar49;
  void *pvVar50;
  long lVar51;
  ulong uVar52;
  size_t sVar53;
  long lVar54;
  int x;
  int _w;
  int iVar55;
  float fVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [28];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar108 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar158 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [64];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  float fVar190;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar189;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_2f8;
  uint local_2d8;
  ulong local_2c8;
  int local_298;
  int iStack_294;
  int local_258;
  undefined1 auStack_254 [12];
  void *local_240;
  Mat local_238;
  undefined8 local_1e8;
  void *local_1d0;
  Mat local_1c8;
  Mat *local_180;
  Mat local_178;
  long local_130;
  void *local_128;
  void *local_120;
  long local_118;
  long local_110;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  void *local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar80 [32];
  undefined1 auVar100 [32];
  undefined1 auVar109 [32];
  
  uVar52 = bottom_blob->elemsize;
  iVar43 = bottom_blob->elempack;
  uVar30 = 1;
  if (opt->use_packing_layout == true) {
    uVar36 = (this->super_DeconvolutionDepthWise).num_output;
    uVar30 = 8;
    if ((uVar36 & 7) != 0) {
      uVar30 = (uint)((uVar36 & 3) == 0) * 3 + 1;
    }
  }
  uVar2 = bottom_blob->w;
  uVar7 = bottom_blob->h;
  auVar119._4_4_ = uVar7;
  auVar119._0_4_ = uVar2;
  uVar3 = (this->super_DeconvolutionDepthWise).kernel_w;
  uVar8 = (this->super_DeconvolutionDepthWise).kernel_h;
  auVar173._4_4_ = uVar8;
  auVar173._0_4_ = uVar3;
  uVar4 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar9 = (this->super_DeconvolutionDepthWise).dilation_h;
  auVar105._4_4_ = uVar9;
  auVar105._0_4_ = uVar4;
  uVar5 = (this->super_DeconvolutionDepthWise).stride_w;
  uVar10 = (this->super_DeconvolutionDepthWise).stride_h;
  auVar158._4_4_ = uVar10;
  auVar158._0_4_ = uVar5;
  uVar36 = bottom_blob->c;
  uVar40 = (ulong)uVar36;
  uVar6 = (this->super_DeconvolutionDepthWise).output_pad_right;
  uVar11 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  auVar169._4_4_ = uVar11;
  auVar169._0_4_ = uVar6;
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  auVar107._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar107._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar107._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar107._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  auVar161 = vpcmpgtd_avx(auVar107,(undefined1  [16])0x0);
  lVar51 = 0x10;
  if (((((auVar161 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar161 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar161 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar161[0xf])
     && ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
          ((this->super_DeconvolutionDepthWise).output_h < 1)) &&
         (lVar51 = 8, &local_238 != top_blob)))) {
    piVar15 = top_blob->refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    local_238.data = top_blob->data;
    local_238.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_238.elemsize = top_blob->elemsize;
    local_238.elempack = top_blob->elempack;
    local_238.allocator = top_blob->allocator;
    auVar161._0_4_ = top_blob->dims;
    auVar161._4_4_ = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    auVar161._8_8_ = CONCAT44(uVar13,uVar12);
    local_238.c = top_blob->c;
    local_238.cstep = top_blob->cstep;
    local_238.dims = auVar161._0_4_;
    local_238.w = auVar161._4_4_;
    local_238._48_8_ = auVar161._8_8_;
  }
  auVar173._8_8_ = 0;
  auVar158._8_8_ = 0;
  auVar169._8_8_ = 0;
  auVar119._8_8_ = 0;
  auVar105._8_8_ = 0;
  auVar161 = vpcmpeqd_avx(auVar161,auVar161);
  auVar107 = vpaddd_avx(auVar173,auVar161);
  auVar105 = vpmulld_avx(auVar107,auVar105);
  auVar107 = vpaddd_avx(auVar119,auVar161);
  auVar107 = vpmulld_avx(auVar158,auVar107);
  auVar107 = vpaddd_avx(auVar105,auVar107);
  auVar107 = vpaddd_avx(auVar107,auVar169);
  auVar107 = vpsubd_avx(auVar107,auVar161);
  sVar53 = (uVar52 / (ulong)(long)iVar43) * (ulong)uVar30;
  _w = auVar107._0_4_;
  iVar42 = auVar107._4_4_;
  Mat::create(&local_238,_w,iVar42,(this->super_DeconvolutionDepthWise).num_output / (int)uVar30,
              sVar53,uVar30,*(Allocator **)(&opt->lightmode + lVar51));
  iVar38 = -100;
  local_180 = top_blob;
  if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
  goto LAB_00443b4e;
  iVar38 = (this->super_DeconvolutionDepthWise).num_output;
  iVar29 = (this->super_DeconvolutionDepthWise).group;
  if (iVar29 == iVar38 && iVar43 * uVar36 == iVar29) {
    iVar29 = (this->super_DeconvolutionDepthWise).kernel_h *
             (this->super_DeconvolutionDepthWise).kernel_w;
    iVar55 = auVar105._0_4_;
    iVar38 = auVar105._4_4_;
    if (iVar43 == 1) {
      if (0 < (int)uVar36) {
        local_118 = local_238.cstep * local_238.elemsize;
        local_120 = local_238.data;
        local_240 = (this->weight_data_tm).data;
        iVar43 = bottom_blob->w;
        local_128 = bottom_blob->data;
        sVar53 = bottom_blob->elemsize;
        local_130 = bottom_blob->cstep * sVar53;
        auVar107 = vpcmpgtd_avx(auVar107,(undefined1  [16])0x0);
        auVar107 = vpmovsxdq_avx(auVar107);
        uVar30 = vmovmskpd_avx(auVar107);
        local_110 = (long)iVar29 << 2;
        local_2f8 = 0;
        do {
          if ((byte)((byte)uVar30 >> 1) != 0) {
            local_1e8 = (void *)(local_130 * local_2f8 + (long)local_128);
            pfVar41 = (float *)(local_118 * local_2f8 + (long)local_120);
            uVar36 = (this->super_DeconvolutionDepthWise).kernel_h;
            iVar29 = (this->super_DeconvolutionDepthWise).bias_term;
            iVar35 = (this->super_DeconvolutionDepthWise).activation_type;
            iVar44 = 0;
            do {
              if ((uVar30 & 1) != 0) {
                local_1d0 = (this->super_DeconvolutionDepthWise).bias_data.data;
                iVar31 = (this->super_DeconvolutionDepthWise).dilation_h;
                pfVar20 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                iVar45 = 0;
                local_258 = -iVar55;
                do {
                  if (iVar29 == 0) {
                    auVar131 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar131 = ZEXT464(*(uint *)((long)local_1d0 + local_2f8 * 4));
                  }
                  auVar107 = auVar131._0_16_;
                  if (0 < (int)uVar36) {
                    iVar14 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar37 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar32 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar52 = 0;
                    pvVar50 = local_240;
                    do {
                      iVar33 = iVar31 * (int)uVar52 + (iVar44 - iVar38);
                      if (((-1 < iVar33) &&
                          (iVar34 = iVar33 / iVar14, iVar34 < (int)uVar7 && iVar33 % iVar14 == 0))
                         && (0 < (int)uVar37)) {
                        uVar48 = 0;
                        iVar33 = local_258;
                        do {
                          if ((-1 < iVar33) &&
                             (iVar39 = iVar33 / iVar32, iVar39 < (int)uVar2 && iVar33 % iVar32 == 0)
                             ) {
                            auVar107 = vfmadd231ss_fma(auVar131._0_16_,
                                                       ZEXT416(*(uint *)((long)pvVar50 + uVar48 * 4)
                                                              ),ZEXT416(*(uint *)((long)local_1e8 +
                                                                                 (long)iVar39 * 4 +
                                                                                 (long)iVar34 *
                                                                                 (long)iVar43 *
                                                                                 sVar53)));
                            auVar131 = ZEXT1664(auVar107);
                          }
                          uVar48 = uVar48 + 1;
                          iVar33 = iVar33 + (this->super_DeconvolutionDepthWise).dilation_w;
                        } while (uVar37 != uVar48);
                      }
                      auVar107 = auVar131._0_16_;
                      uVar52 = uVar52 + 1;
                      pvVar50 = (void *)((long)pvVar50 + (ulong)uVar37 * 4);
                    } while (uVar52 != uVar36);
                  }
                  fVar189 = auVar107._0_4_;
                  fVar56 = fVar189;
                  switch(iVar35) {
                  case 1:
                    auVar107 = vmaxss_avx(auVar107,ZEXT416(0));
                    fVar56 = auVar107._0_4_;
                    break;
                  case 2:
                    auVar107 = vcmpss_avx(ZEXT816(0) << 0x40,auVar107,1);
                    auVar70._8_4_ = 0x3f800000;
                    auVar70._0_8_ = 0x3f8000003f800000;
                    auVar70._12_4_ = 0x3f800000;
                    auVar107 = vblendvps_avx(ZEXT416((uint)*pfVar20),auVar70,auVar107);
                    fVar56 = auVar107._0_4_ * fVar189;
                    break;
                  case 3:
                    auVar107 = vmaxss_avx(auVar107,ZEXT416((uint)*pfVar20));
                    fVar56 = auVar107._0_4_;
                    if (pfVar20[1] < auVar107._0_4_) {
                      fVar56 = pfVar20[1];
                    }
                    break;
                  case 4:
                    auVar107 = vminss_avx(auVar107,ZEXT416(0x42b0c0a5));
                    auVar77._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
                    auVar77._8_4_ = auVar107._8_4_ ^ 0x80000000;
                    auVar77._12_4_ = auVar107._12_4_ ^ 0x80000000;
                    auVar107 = vcmpss_avx(auVar107,ZEXT416(0xc2b0c0a5),1);
                    auVar94._8_4_ = 0x42b0c0a5;
                    auVar94._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar94._12_4_ = 0x42b0c0a5;
                    auVar107 = vblendvps_avx(auVar77,auVar94,auVar107);
                    fVar56 = expf(auVar107._0_4_);
                    fVar56 = 1.0 / (fVar56 + 1.0);
                    break;
                  case 5:
                    fVar56 = expf(fVar189);
                    fVar56 = logf(fVar56 + 1.0);
                    fVar56 = tanhf(fVar56);
                    fVar56 = fVar56 * fVar189;
                    break;
                  case 6:
                    fVar190 = *pfVar20;
                    fVar104 = -pfVar20[1] / fVar190;
                    fVar56 = 0.0;
                    if ((fVar104 <= fVar189) &&
                       (fVar56 = fVar189, fVar189 <= fVar104 + 1.0 / fVar190)) {
                      auVar107 = vfmadd213ss_fma(ZEXT416((uint)fVar190),auVar107,
                                                 ZEXT416((uint)pfVar20[1]));
                      fVar56 = auVar107._0_4_ * fVar189;
                    }
                  }
                  *pfVar41 = fVar56;
                  pfVar41 = pfVar41 + 1;
                  iVar45 = iVar45 + 1;
                  local_258 = local_258 + 1;
                } while (iVar45 != _w);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != iVar42);
          }
          local_2f8 = local_2f8 + 1;
          local_240 = (void *)((long)local_240 + local_110);
        } while (local_2f8 != uVar40);
      }
    }
    else if (iVar43 == 4) {
      if (0 < (int)uVar36) {
        auVar107 = vpcmpgtd_avx(auVar107,(undefined1  [16])0x0);
        auVar107 = vpmovsxdq_avx(auVar107);
        uVar30 = vmovmskpd_avx(auVar107);
        local_2c8 = 0;
        auVar160 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar172 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar175 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar130._8_4_ = 0x3f000000;
        auVar130._0_8_ = 0x3f0000003f000000;
        auVar130._12_4_ = 0x3f000000;
        auVar176 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar84 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar177 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar174 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar180 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        auVar131 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
        auVar179 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
        do {
          if ((byte)((byte)uVar30 >> 1) != 0) {
            pvVar50 = (this->weight_data_tm).data;
            sVar53 = bottom_blob->cstep;
            sVar16 = bottom_blob->elemsize;
            pvVar17 = bottom_blob->data;
            iVar43 = bottom_blob->w;
            pauVar47 = (undefined1 (*) [16])
                       (local_238.cstep * local_2c8 * local_238.elemsize + (long)local_238.data);
            local_1d0 = (void *)(local_2c8 * 0x10);
            iVar35 = 0;
            do {
              if ((uVar30 & 1) != 0) {
                iVar31 = 0;
                iVar44 = -iVar55;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar181 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar181 = *(undefined1 (*) [16])
                                ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                (long)local_1d0);
                  }
                  auVar188 = ZEXT1664(auVar181);
                  iVar45 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar45) {
                    iVar14 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar36 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar32 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar52 = 0;
                    lVar51 = 0;
                    do {
                      iVar33 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar51 +
                               (iVar35 - iVar38);
                      if ((((-1 < iVar33) && (iVar34 = iVar33 / iVar14, iVar33 % iVar14 == 0)) &&
                          (iVar34 < (int)uVar7)) && (0 < (int)uVar36)) {
                        uVar48 = (ulong)uVar36;
                        uVar49 = uVar52;
                        iVar33 = iVar44;
                        do {
                          if ((-1 < iVar33) &&
                             (iVar39 = iVar33 / iVar32, iVar39 < (int)uVar2 && iVar33 % iVar32 == 0)
                             ) {
                            auVar107 = vfmadd231ps_fma(auVar188._0_16_,
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar17 +
                                                        (long)(iVar39 << 2) * 4 +
                                                        (long)iVar34 * (long)iVar43 * sVar16 +
                                                        sVar53 * local_2c8 * sVar16),
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar50 +
                                                        (uVar49 & 0xffffffff) * 4 +
                                                        (long)(iVar29 * 4 * (int)local_2c8) * 4));
                            auVar188 = ZEXT1664(auVar107);
                          }
                          iVar33 = iVar33 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar49 = uVar49 + 4;
                          uVar48 = uVar48 - 1;
                        } while (uVar48 != 0);
                      }
                      auVar181 = auVar188._0_16_;
                      lVar51 = lVar51 + 1;
                      uVar52 = uVar52 + (ulong)uVar36 * 4;
                    } while (lVar51 != iVar45);
                  }
                  auVar119 = auVar176._0_16_;
                  auVar107 = auVar131._0_16_;
                  auVar105 = auVar84._0_16_;
                  auVar161 = auVar174._0_16_;
                  auVar94 = auVar180._0_16_;
                  auVar77 = auVar177._0_16_;
                  auVar173 = auVar175._0_16_;
                  auVar169 = auVar172._0_16_;
                  auVar158 = auVar160._0_16_;
                  fVar56 = auVar181._4_4_;
                  fVar189 = auVar181._8_4_;
                  fVar190 = auVar181._12_4_;
                  switch((this->super_DeconvolutionDepthWise).activation_type) {
                  case 1:
                    auVar181 = vmaxps_avx(auVar181,_DAT_005b2300);
                    break;
                  case 2:
                    auVar107 = vmaxps_avx(auVar181,(undefined1  [16])0x0);
                    auVar161 = vminps_avx(auVar181,(undefined1  [16])0x0);
                    uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar184._4_4_ = uVar1;
                    auVar184._0_4_ = uVar1;
                    auVar184._8_4_ = uVar1;
                    auVar184._12_4_ = uVar1;
                    auVar181 = vfmadd213ps_fma(auVar184,auVar161,auVar107);
                    break;
                  case 3:
                    puVar18 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar18;
                    auVar73._4_4_ = uVar1;
                    auVar73._0_4_ = uVar1;
                    auVar73._8_4_ = uVar1;
                    auVar73._12_4_ = uVar1;
                    uVar1 = puVar18[1];
                    auVar146._4_4_ = uVar1;
                    auVar146._0_4_ = uVar1;
                    auVar146._8_4_ = uVar1;
                    auVar146._12_4_ = uVar1;
                    auVar107 = vmaxps_avx(auVar181,auVar73);
                    auVar181 = vminps_avx(auVar146,auVar107);
                    break;
                  case 4:
                    auVar74._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
                    auVar74._8_4_ = -fVar189;
                    auVar74._12_4_ = -fVar190;
                    auVar158 = vminps_avx(auVar158,auVar74);
                    auVar70 = vmaxps_avx(auVar169,auVar158);
                    auVar158 = vfmadd213ps_fma(auVar173,auVar70,auVar130);
                    auVar182._0_4_ = (int)auVar158._0_4_;
                    auVar182._4_4_ = (int)auVar158._4_4_;
                    auVar182._8_4_ = (int)auVar158._8_4_;
                    auVar182._12_4_ = (int)auVar158._12_4_;
                    auVar169 = vcvtdq2ps_avx(auVar182);
                    auVar158 = vcmpps_avx(auVar158,auVar169,1);
                    auVar158 = vandps_avx(auVar158,auVar119);
                    auVar158 = vsubps_avx(auVar169,auVar158);
                    auVar105 = vfmsub231ps_fma(auVar70,auVar158,auVar105);
                    auVar92._8_4_ = 0x395e8083;
                    auVar92._0_8_ = 0x395e8083395e8083;
                    auVar92._12_4_ = 0x395e8083;
                    auVar105 = vfmsub231ps_fma(auVar105,auVar158,auVar92);
                    auVar183._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                    auVar183._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                    auVar183._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                    auVar183._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                    auVar161 = vfmadd213ps_fma(auVar161,auVar105,auVar77);
                    auVar161 = vfmadd213ps_fma(auVar161,auVar105,auVar94);
                    auVar107 = vfmadd213ps_fma(auVar161,auVar105,auVar107);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar179._0_16_);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar130);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar183,auVar105);
                    auVar75._0_4_ = auVar107._0_4_ + auVar176._0_4_;
                    auVar75._4_4_ = auVar107._4_4_ + auVar176._4_4_;
                    auVar75._8_4_ = auVar107._8_4_ + auVar176._8_4_;
                    auVar75._12_4_ = auVar107._12_4_ + auVar176._12_4_;
                    auVar147._0_4_ = (int)auVar158._0_4_;
                    auVar147._4_4_ = (int)auVar158._4_4_;
                    auVar147._8_4_ = (int)auVar158._8_4_;
                    auVar147._12_4_ = (int)auVar158._12_4_;
                    auVar107 = vpslld_avx(auVar147,0x17);
                    auVar107 = vpaddd_avx(auVar107,auVar119);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar75,auVar119);
                    auVar181 = vdivps_avx(auVar119,auVar107);
                    break;
                  case 5:
                    auVar70 = vminps_avx(auVar181,auVar158);
                    auVar93 = vmaxps_avx(auVar169,auVar70);
                    auVar70 = vfmadd213ps_fma(auVar173,auVar93,auVar130);
                    auVar162._0_4_ = (int)auVar70._0_4_;
                    auVar162._4_4_ = (int)auVar70._4_4_;
                    auVar162._8_4_ = (int)auVar70._8_4_;
                    auVar162._12_4_ = (int)auVar70._12_4_;
                    auVar76 = vcvtdq2ps_avx(auVar162);
                    auVar70 = vcmpps_avx(auVar70,auVar76,1);
                    auVar70 = vandps_avx(auVar70,auVar119);
                    auVar70 = vsubps_avx(auVar76,auVar70);
                    auVar76 = vfmsub231ps_fma(auVar93,auVar70,auVar105);
                    auVar86._8_4_ = 0xb95e8083;
                    auVar86._0_8_ = 0xb95e8083b95e8083;
                    auVar86._12_4_ = 0xb95e8083;
                    auVar93 = vfnmsub231ps_fma(auVar76,auVar70,auVar86);
                    auVar163._0_4_ = auVar93._0_4_ * auVar93._0_4_;
                    auVar163._4_4_ = auVar93._4_4_ * auVar93._4_4_;
                    auVar163._8_4_ = auVar93._8_4_ * auVar93._8_4_;
                    auVar163._12_4_ = auVar93._12_4_ * auVar93._12_4_;
                    auVar76 = vfmadd213ps_fma(auVar161,auVar93,auVar77);
                    auVar76 = vfmadd213ps_fma(auVar76,auVar93,auVar94);
                    auVar76 = vfmadd213ps_fma(auVar76,auVar93,auVar107);
                    auVar76 = vfmadd213ps_fma(auVar76,auVar93,auVar179._0_16_);
                    auVar76 = vfmadd213ps_fma(auVar76,auVar93,auVar130);
                    auVar76 = vfmadd213ps_fma(auVar76,auVar163,auVar93);
                    auVar87._0_4_ = auVar76._0_4_ + auVar176._0_4_;
                    auVar87._4_4_ = auVar76._4_4_ + auVar176._4_4_;
                    auVar87._8_4_ = auVar76._8_4_ + auVar176._8_4_;
                    auVar87._12_4_ = auVar76._12_4_ + auVar176._12_4_;
                    auVar69._0_4_ = (int)auVar70._0_4_;
                    auVar69._4_4_ = (int)auVar70._4_4_;
                    auVar69._8_4_ = (int)auVar70._8_4_;
                    auVar69._12_4_ = (int)auVar70._12_4_;
                    auVar70 = vpslld_avx(auVar69,0x17);
                    auVar70 = vpaddd_avx(auVar70,auVar119);
                    auVar69 = vfmadd213ps_fma(auVar70,auVar87,auVar119);
                    auVar88._8_4_ = 0x800000;
                    auVar88._0_8_ = 0x80000000800000;
                    auVar88._12_4_ = 0x800000;
                    auVar119 = vmaxps_avx(auVar69,auVar88);
                    auVar70 = vpsrld_avx(auVar119,0x17);
                    auVar120._8_4_ = 0xffffff82;
                    auVar120._0_8_ = 0xffffff82ffffff82;
                    auVar120._12_4_ = 0xffffff82;
                    auVar70 = vpaddd_avx(auVar70,auVar120);
                    auVar121._8_4_ = 0x807fffff;
                    auVar121._0_8_ = 0x807fffff807fffff;
                    auVar121._12_4_ = 0x807fffff;
                    auVar119 = vandps_avx(auVar119,auVar121);
                    auVar93 = vorps_avx(auVar119,auVar130);
                    auVar76 = vcvtdq2ps_avx(auVar70);
                    auVar122._8_4_ = 0x3f3504f3;
                    auVar122._0_8_ = 0x3f3504f33f3504f3;
                    auVar122._12_4_ = 0x3f3504f3;
                    auVar70 = vcmpps_avx(auVar93,auVar122,1);
                    auVar119 = vandps_avx(auVar70,auVar93);
                    auVar89._0_4_ = auVar93._0_4_ + -1.0 + auVar119._0_4_;
                    auVar89._4_4_ = auVar93._4_4_ + -1.0 + auVar119._4_4_;
                    auVar89._8_4_ = auVar93._8_4_ + -1.0 + auVar119._8_4_;
                    auVar89._12_4_ = auVar93._12_4_ + -1.0 + auVar119._12_4_;
                    auVar123._8_4_ = 0x3f800000;
                    auVar123._0_8_ = 0x3f8000003f800000;
                    auVar123._12_4_ = 0x3f800000;
                    auVar119 = vandps_avx(auVar70,auVar123);
                    auVar70 = vsubps_avx(auVar76,auVar119);
                    auVar145._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                    auVar145._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                    auVar145._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                    auVar145._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                    auVar164._8_4_ = 0x3d9021bb;
                    auVar164._0_8_ = 0x3d9021bb3d9021bb;
                    auVar164._12_4_ = 0x3d9021bb;
                    auVar132._8_4_ = 0xbdebd1b8;
                    auVar132._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar132._12_4_ = 0xbdebd1b8;
                    auVar119 = vfmadd213ps_fma(auVar164,auVar89,auVar132);
                    auVar133._8_4_ = 0x3def251a;
                    auVar133._0_8_ = 0x3def251a3def251a;
                    auVar133._12_4_ = 0x3def251a;
                    auVar119 = vfmadd213ps_fma(auVar119,auVar89,auVar133);
                    auVar134._8_4_ = 0xbdfe5d4f;
                    auVar134._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar134._12_4_ = 0xbdfe5d4f;
                    auVar119 = vfmadd213ps_fma(auVar119,auVar89,auVar134);
                    auVar135._8_4_ = 0x3e11e9bf;
                    auVar135._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar135._12_4_ = 0x3e11e9bf;
                    auVar119 = vfmadd213ps_fma(auVar119,auVar89,auVar135);
                    auVar136._8_4_ = 0xbe2aae50;
                    auVar136._0_8_ = 0xbe2aae50be2aae50;
                    auVar136._12_4_ = 0xbe2aae50;
                    auVar119 = vfmadd213ps_fma(auVar119,auVar89,auVar136);
                    auVar137._8_4_ = 0x3e4cceac;
                    auVar137._0_8_ = 0x3e4cceac3e4cceac;
                    auVar137._12_4_ = 0x3e4cceac;
                    auVar119 = vfmadd213ps_fma(auVar119,auVar89,auVar137);
                    auVar138._8_4_ = 0xbe7ffffc;
                    auVar138._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar138._12_4_ = 0xbe7ffffc;
                    auVar119 = vfmadd213ps_fma(auVar119,auVar89,auVar138);
                    auVar139._8_4_ = 0x3eaaaaaa;
                    auVar139._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar139._12_4_ = 0x3eaaaaaa;
                    auVar119 = vfmadd213ps_fma(auVar119,auVar89,auVar139);
                    auVar159._0_4_ = auVar145._0_4_ * auVar89._0_4_ * auVar119._0_4_;
                    auVar159._4_4_ = auVar145._4_4_ * auVar89._4_4_ * auVar119._4_4_;
                    auVar159._8_4_ = auVar145._8_4_ * auVar89._8_4_ * auVar119._8_4_;
                    auVar159._12_4_ = auVar145._12_4_ * auVar89._12_4_ * auVar119._12_4_;
                    auVar165._8_4_ = 0xb95e8083;
                    auVar165._0_8_ = 0xb95e8083b95e8083;
                    auVar165._12_4_ = 0xb95e8083;
                    auVar119 = vfmadd231ps_fma(auVar159,auVar70,auVar165);
                    auVar76 = vfmsub231ps_fma(auVar119,auVar130,auVar145);
                    auVar119 = vcmpps_avx(auVar69,_DAT_005b2300,2);
                    auVar76 = vsubps_avx(auVar76,auVar89);
                    auVar160 = ZEXT1664(auVar158);
                    auVar172 = ZEXT1664(auVar169);
                    auVar175 = ZEXT1664(auVar173);
                    auVar177 = ZEXT1664(auVar77);
                    auVar180 = ZEXT1664(auVar94);
                    auVar174 = ZEXT1664(auVar161);
                    auVar84 = ZEXT1664(auVar105);
                    auVar131 = ZEXT1664(auVar107);
                    auVar70 = vfnmadd231ps_fma(auVar76,auVar105,auVar70);
                    auVar90._0_4_ = auVar70._0_4_ + auVar70._0_4_;
                    auVar90._4_4_ = auVar70._4_4_ + auVar70._4_4_;
                    auVar90._8_4_ = auVar70._8_4_ + auVar70._8_4_;
                    auVar90._12_4_ = auVar70._12_4_ + auVar70._12_4_;
                    auVar124._8_4_ = 0x7fffffff;
                    auVar124._0_8_ = 0x7fffffff7fffffff;
                    auVar124._12_4_ = 0x7fffffff;
                    auVar119 = vblendvps_avx(auVar90,auVar124,auVar119);
                    auVar119 = vminps_avx(auVar158,auVar119);
                    auVar169 = vmaxps_avx(auVar169,auVar119);
                    auVar119 = vfmadd213ps_fma(auVar173,auVar169,auVar130);
                    auVar125._0_4_ = (int)auVar119._0_4_;
                    auVar125._4_4_ = (int)auVar119._4_4_;
                    auVar125._8_4_ = (int)auVar119._8_4_;
                    auVar125._12_4_ = (int)auVar119._12_4_;
                    auVar158 = vcvtdq2ps_avx(auVar125);
                    auVar119 = vcmpps_avx(auVar119,auVar158,1);
                    auVar140._8_4_ = 0x3f800000;
                    auVar140._0_8_ = 0x3f8000003f800000;
                    auVar140._12_4_ = 0x3f800000;
                    auVar119 = vandps_avx(auVar119,auVar140);
                    auVar141._8_4_ = 0x3e2aaaaa;
                    auVar141._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar141._12_4_ = 0x3e2aaaaa;
                    auVar179 = ZEXT1664(auVar141);
                    auVar119 = vsubps_avx(auVar158,auVar119);
                    auVar105 = vfmsub231ps_fma(auVar169,auVar119,auVar105);
                    auVar126._8_4_ = 0xb95e8083;
                    auVar126._0_8_ = 0xb95e8083b95e8083;
                    auVar126._12_4_ = 0xb95e8083;
                    auVar105 = vfnmsub231ps_fma(auVar105,auVar119,auVar126);
                    auVar127._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                    auVar127._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                    auVar127._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                    auVar127._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                    auVar161 = vfmadd213ps_fma(auVar161,auVar105,auVar77);
                    auVar161 = vfmadd213ps_fma(auVar161,auVar105,auVar94);
                    auVar107 = vfmadd213ps_fma(auVar161,auVar105,auVar107);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar141);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar130);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar127,auVar105);
                    auVar128._8_4_ = 0x3f800000;
                    auVar128._0_8_ = 0x3f8000003f800000;
                    auVar128._12_4_ = 0x3f800000;
                    auVar176 = ZEXT1664(auVar128);
                    auVar71._0_4_ = auVar107._0_4_ + 1.0;
                    auVar71._4_4_ = auVar107._4_4_ + 1.0;
                    auVar71._8_4_ = auVar107._8_4_ + 1.0;
                    auVar71._12_4_ = auVar107._12_4_ + 1.0;
                    auVar91._0_4_ = (int)auVar119._0_4_;
                    auVar91._4_4_ = (int)auVar119._4_4_;
                    auVar91._8_4_ = (int)auVar119._8_4_;
                    auVar91._12_4_ = (int)auVar119._12_4_;
                    auVar107 = vpslld_avx(auVar91,0x17);
                    auVar107 = vpaddd_avx(auVar107,auVar128);
                    auVar107 = vfmadd213ps_fma(auVar107,auVar71,auVar128);
                    auVar72._8_4_ = 0x40000000;
                    auVar72._0_8_ = 0x4000000040000000;
                    auVar72._12_4_ = 0x40000000;
                    auVar107 = vdivps_avx(auVar72,auVar107);
                    auVar181 = vfmsub231ps_fma(auVar181,auVar181,auVar107);
                    break;
                  case 6:
                    puVar18 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar18;
                    auVar76._4_4_ = uVar1;
                    auVar76._0_4_ = uVar1;
                    auVar76._8_4_ = uVar1;
                    auVar76._12_4_ = uVar1;
                    uVar1 = puVar18[1];
                    auVar93._4_4_ = uVar1;
                    auVar93._0_4_ = uVar1;
                    auVar93._8_4_ = uVar1;
                    auVar93._12_4_ = uVar1;
                    auVar107 = vfmadd231ps_fma(auVar93,auVar181,auVar76);
                    auVar107 = vmaxps_avx(auVar107,_DAT_005b2300);
                    auVar107 = vminps_avx(auVar107,auVar119);
                    auVar181._0_4_ = auVar181._0_4_ * auVar107._0_4_;
                    auVar181._4_4_ = fVar56 * auVar107._4_4_;
                    auVar181._8_4_ = fVar189 * auVar107._8_4_;
                    auVar181._12_4_ = fVar190 * auVar107._12_4_;
                  }
                  *pauVar47 = auVar181;
                  pauVar47 = pauVar47 + 1;
                  iVar31 = iVar31 + 1;
                  iVar44 = iVar44 + 1;
                } while (iVar31 != _w);
              }
              iVar35 = iVar35 + 1;
            } while (iVar35 != iVar42);
          }
          local_2c8 = local_2c8 + 1;
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,uVar7);
        } while (local_2c8 != uVar40);
      }
    }
    else if ((iVar43 == 8) && (0 < (int)uVar36)) {
      auVar107 = vpcmpgtd_avx(auVar107,(undefined1  [16])0x0);
      auVar107 = vpmovsxdq_avx(auVar107);
      uVar30 = vmovmskpd_avx(auVar107);
      local_2c8 = 0;
      auVar174 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar142._8_4_ = 0x3f000000;
      auVar142._0_8_ = 0x3f0000003f000000;
      auVar142._12_4_ = 0x3f000000;
      auVar142._16_4_ = 0x3f000000;
      auVar142._20_4_ = 0x3f000000;
      auVar142._24_4_ = 0x3f000000;
      auVar142._28_4_ = 0x3f000000;
      auVar176 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar131 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar179 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if ((byte)((byte)uVar30 >> 1) != 0) {
          pvVar50 = (this->weight_data_tm).data;
          sVar53 = bottom_blob->cstep;
          sVar16 = bottom_blob->elemsize;
          pvVar17 = bottom_blob->data;
          iVar43 = bottom_blob->w;
          pauVar46 = (undefined1 (*) [32])
                     (local_238.cstep * local_2c8 * local_238.elemsize + (long)local_238.data);
          local_1d0 = (void *)(local_2c8 * 0x20);
          iVar35 = 0;
          do {
            if ((uVar30 & 1) != 0) {
              iVar31 = 0;
              iVar44 = -iVar55;
              do {
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar84 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar84 = ZEXT3264(*(undefined1 (*) [32])
                                      ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                      (long)local_1d0));
                }
                lVar51 = (long)(this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < lVar51) {
                  iVar45 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar36 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar14 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar52 = 0;
                  lVar54 = 0;
                  do {
                    iVar32 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar54 +
                             (iVar35 - iVar38);
                    if ((((-1 < iVar32) && (iVar33 = iVar32 / iVar45, iVar32 % iVar45 == 0)) &&
                        (iVar33 < (int)uVar7)) && (0 < (int)uVar36)) {
                      uVar48 = (ulong)uVar36;
                      uVar49 = uVar52;
                      iVar32 = iVar44;
                      do {
                        if ((-1 < iVar32) &&
                           (iVar34 = iVar32 / iVar14, iVar34 < (int)uVar2 && iVar32 % iVar14 == 0))
                        {
                          auVar107 = vfmadd231ps_fma(auVar84._0_32_,
                                                     *(undefined1 (*) [32])
                                                      ((long)pvVar17 +
                                                      (long)(iVar34 << 3) * 4 +
                                                      (long)iVar33 * (long)iVar43 * sVar16 +
                                                      sVar53 * local_2c8 * sVar16),
                                                     *(undefined1 (*) [32])
                                                      ((long)pvVar50 +
                                                      (uVar49 & 0xffffffff) * 4 +
                                                      (long)(iVar29 * 8 * (int)local_2c8) * 4));
                          auVar84 = ZEXT1664(auVar107);
                        }
                        iVar32 = iVar32 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar49 = uVar49 + 8;
                        uVar48 = uVar48 - 1;
                      } while (uVar48 != 0);
                    }
                    lVar54 = lVar54 + 1;
                    uVar52 = uVar52 + (ulong)uVar36 * 8;
                  } while (lVar54 != lVar51);
                }
                auVar83 = auVar84._0_32_;
                auVar64 = auVar131._0_32_;
                auVar62 = auVar179._0_32_;
                auVar79 = auVar174._0_32_;
                auVar117 = auVar176._0_32_;
                fVar56 = auVar131._0_4_;
                fVar189 = auVar131._4_4_;
                fVar190 = auVar131._8_4_;
                fVar104 = auVar131._12_4_;
                fVar21 = auVar131._16_4_;
                fVar22 = auVar131._20_4_;
                fVar23 = auVar131._24_4_;
                fVar24 = auVar131._28_4_;
                auVar160._28_36_ = auVar84._28_36_;
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar83 = vmaxps_avx(auVar83,_DAT_005b5560);
                  break;
                case 2:
                  auVar64 = vmaxps_avx(auVar83,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar83 = vminps_avx(auVar83,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar82._4_4_ = uVar1;
                  auVar82._0_4_ = uVar1;
                  auVar82._8_4_ = uVar1;
                  auVar82._12_4_ = uVar1;
                  auVar82._16_4_ = uVar1;
                  auVar82._20_4_ = uVar1;
                  auVar82._24_4_ = uVar1;
                  auVar82._28_4_ = uVar1;
                  auVar107 = vfmadd213ps_fma(auVar82,auVar83,auVar64);
                  auVar83 = ZEXT1632(auVar107);
                  break;
                case 3:
                  puVar18 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar18;
                  auVar102._4_4_ = uVar1;
                  auVar102._0_4_ = uVar1;
                  auVar102._8_4_ = uVar1;
                  auVar102._12_4_ = uVar1;
                  auVar102._16_4_ = uVar1;
                  auVar102._20_4_ = uVar1;
                  auVar102._24_4_ = uVar1;
                  auVar102._28_4_ = uVar1;
                  uVar1 = puVar18[1];
                  auVar187._4_4_ = uVar1;
                  auVar187._0_4_ = uVar1;
                  auVar187._8_4_ = uVar1;
                  auVar187._12_4_ = uVar1;
                  auVar187._16_4_ = uVar1;
                  auVar187._20_4_ = uVar1;
                  auVar187._24_4_ = uVar1;
                  auVar187._28_4_ = uVar1;
                  auVar83 = vmaxps_avx(auVar83,auVar102);
                  auVar83 = vminps_avx(auVar187,auVar83);
                  break;
                case 4:
                  auVar78._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
                  auVar78._8_4_ = -auVar84._8_4_;
                  auVar78._12_4_ = -auVar84._12_4_;
                  auVar78._16_4_ = -auVar84._16_4_;
                  auVar78._20_4_ = -auVar84._20_4_;
                  auVar78._24_4_ = -auVar84._24_4_;
                  auVar78._28_4_ = auVar84._28_4_ ^ 0x80000000;
                  auVar65._8_4_ = 0x42b0c0a5;
                  auVar65._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar65._12_4_ = 0x42b0c0a5;
                  auVar65._16_4_ = 0x42b0c0a5;
                  auVar65._20_4_ = 0x42b0c0a5;
                  auVar65._24_4_ = 0x42b0c0a5;
                  auVar65._28_4_ = 0x42b0c0a5;
                  auVar83 = vminps_avx(auVar78,auVar65);
                  auVar79 = vmaxps_avx(auVar79,auVar83);
                  auVar107 = vfmadd213ps_fma(auVar117,auVar79,auVar142);
                  auVar117 = vroundps_avx(ZEXT1632(auVar107),1);
                  auVar83 = vcmpps_avx(ZEXT1632(auVar107),auVar117,1);
                  auVar83 = vandps_avx(auVar83,auVar64);
                  auVar83 = vsubps_avx(auVar117,auVar83);
                  auVar66._8_4_ = 0x3f318000;
                  auVar66._0_8_ = 0x3f3180003f318000;
                  auVar66._12_4_ = 0x3f318000;
                  auVar66._16_4_ = 0x3f318000;
                  auVar66._20_4_ = 0x3f318000;
                  auVar66._24_4_ = 0x3f318000;
                  auVar66._28_4_ = 0x3f318000;
                  auVar107 = vfmsub231ps_fma(auVar79,auVar83,auVar66);
                  auVar113._8_4_ = 0x395e8083;
                  auVar113._0_8_ = 0x395e8083395e8083;
                  auVar113._12_4_ = 0x395e8083;
                  auVar113._16_4_ = 0x395e8083;
                  auVar113._20_4_ = 0x395e8083;
                  auVar113._24_4_ = 0x395e8083;
                  auVar113._28_4_ = 0x395e8083;
                  auVar161 = vfmsub231ps_fma(ZEXT1632(auVar107),auVar83,auVar113);
                  auVar79 = ZEXT1632(auVar161);
                  auVar26._28_4_ = auVar117._28_4_;
                  auVar26._0_28_ =
                       ZEXT1628(CONCAT412(auVar161._12_4_ * auVar161._12_4_,
                                          CONCAT48(auVar161._8_4_ * auVar161._8_4_,
                                                   CONCAT44(auVar161._4_4_ * auVar161._4_4_,
                                                            auVar161._0_4_ * auVar161._0_4_))));
                  auVar67._8_4_ = 0x3ab743ce;
                  auVar67._0_8_ = 0x3ab743ce3ab743ce;
                  auVar67._12_4_ = 0x3ab743ce;
                  auVar67._16_4_ = 0x3ab743ce;
                  auVar67._20_4_ = 0x3ab743ce;
                  auVar67._24_4_ = 0x3ab743ce;
                  auVar67._28_4_ = 0x3ab743ce;
                  auVar107 = vfmadd213ps_fma(auVar62,auVar79,auVar67);
                  auVar114._8_4_ = 0x3c088908;
                  auVar114._0_8_ = 0x3c0889083c088908;
                  auVar114._12_4_ = 0x3c088908;
                  auVar114._16_4_ = 0x3c088908;
                  auVar114._20_4_ = 0x3c088908;
                  auVar114._24_4_ = 0x3c088908;
                  auVar114._28_4_ = 0x3c088908;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar114);
                  auVar115._8_4_ = 0x3d2aa9c1;
                  auVar115._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar115._12_4_ = 0x3d2aa9c1;
                  auVar115._16_4_ = 0x3d2aa9c1;
                  auVar115._20_4_ = 0x3d2aa9c1;
                  auVar115._24_4_ = 0x3d2aa9c1;
                  auVar115._28_4_ = 0x3d2aa9c1;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar115);
                  auVar116._8_4_ = 0x3e2aaaaa;
                  auVar116._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar116._12_4_ = 0x3e2aaaaa;
                  auVar116._16_4_ = 0x3e2aaaaa;
                  auVar116._20_4_ = 0x3e2aaaaa;
                  auVar116._24_4_ = 0x3e2aaaaa;
                  auVar116._28_4_ = 0x3e2aaaaa;
                  auVar79 = ZEXT1632(auVar161);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar116);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar142);
                  auVar119 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar26,auVar79);
                  auVar68._0_4_ = (int)auVar83._0_4_;
                  auVar68._4_4_ = (int)auVar83._4_4_;
                  auVar68._8_4_ = (int)auVar83._8_4_;
                  auVar68._12_4_ = (int)auVar83._12_4_;
                  auVar80._16_4_ = (int)auVar83._16_4_;
                  auVar80._0_16_ = auVar68;
                  auVar80._20_4_ = (int)auVar83._20_4_;
                  auVar80._24_4_ = (int)auVar83._24_4_;
                  auVar80._28_4_ = (int)auVar83._28_4_;
                  auVar161 = vpslld_avx(auVar68,0x17);
                  auVar107 = vpslld_avx(auVar80._16_16_,0x17);
                  auVar108._8_4_ = 0x3f800000;
                  auVar108._0_8_ = 0x3f8000003f800000;
                  auVar108._12_4_ = 0x3f800000;
                  auVar107 = vpaddd_avx(auVar107,auVar108);
                  auVar161 = vpaddd_avx(auVar161,auVar108);
                  auVar81._16_16_ = auVar107;
                  auVar81._0_16_ = auVar161;
                  auVar103._0_4_ = auVar119._0_4_ + fVar56;
                  auVar103._4_4_ = auVar119._4_4_ + fVar189;
                  auVar103._8_4_ = auVar119._8_4_ + fVar190;
                  auVar103._12_4_ = auVar119._12_4_ + fVar104;
                  auVar103._16_4_ = fVar21 + 0.0;
                  auVar103._20_4_ = fVar22 + 0.0;
                  auVar103._24_4_ = fVar23 + 0.0;
                  auVar103._28_4_ = fVar24 + 0.0;
                  auVar107 = vfmadd213ps_fma(auVar81,auVar103,auVar64);
                  auVar83 = vdivps_avx(auVar64,ZEXT1632(auVar107));
                  break;
                case 5:
                  auVar170._8_4_ = 0x42b0c0a5;
                  auVar170._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar170._12_4_ = 0x42b0c0a5;
                  auVar170._16_4_ = 0x42b0c0a5;
                  auVar170._20_4_ = 0x42b0c0a5;
                  auVar170._24_4_ = 0x42b0c0a5;
                  auVar170._28_4_ = 0x42b0c0a5;
                  auVar83 = vminps_avx(auVar170,auVar83);
                  auVar25 = vmaxps_avx(auVar79,auVar83);
                  auVar107 = vfmadd213ps_fma(auVar117,auVar25,auVar142);
                  auVar96 = vroundps_avx(ZEXT1632(auVar107),1);
                  auVar83 = vcmpps_avx(ZEXT1632(auVar107),auVar96,1);
                  auVar83 = vandps_avx(auVar83,auVar64);
                  auVar83 = vsubps_avx(auVar96,auVar83);
                  auVar143._8_4_ = 0x3f318000;
                  auVar143._0_8_ = 0x3f3180003f318000;
                  auVar143._12_4_ = 0x3f318000;
                  auVar143._16_4_ = 0x3f318000;
                  auVar143._20_4_ = 0x3f318000;
                  auVar143._24_4_ = 0x3f318000;
                  auVar143._28_4_ = 0x3f318000;
                  auVar107 = vfmsub231ps_fma(auVar25,auVar83,auVar143);
                  auVar57._8_4_ = 0xb95e8083;
                  auVar57._0_8_ = 0xb95e8083b95e8083;
                  auVar57._12_4_ = 0xb95e8083;
                  auVar57._16_4_ = 0xb95e8083;
                  auVar57._20_4_ = 0xb95e8083;
                  auVar57._24_4_ = 0xb95e8083;
                  auVar57._28_4_ = 0xb95e8083;
                  auVar161 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar83,auVar57);
                  auVar57 = ZEXT1632(auVar161);
                  auVar25._28_4_ = auVar96._28_4_;
                  auVar25._0_28_ =
                       ZEXT1628(CONCAT412(auVar161._12_4_ * auVar161._12_4_,
                                          CONCAT48(auVar161._8_4_ * auVar161._8_4_,
                                                   CONCAT44(auVar161._4_4_ * auVar161._4_4_,
                                                            auVar161._0_4_ * auVar161._0_4_))));
                  auVar178._8_4_ = 0x3ab743ce;
                  auVar178._0_8_ = 0x3ab743ce3ab743ce;
                  auVar178._12_4_ = 0x3ab743ce;
                  auVar178._16_4_ = 0x3ab743ce;
                  auVar178._20_4_ = 0x3ab743ce;
                  auVar178._24_4_ = 0x3ab743ce;
                  auVar178._28_4_ = 0x3ab743ce;
                  auVar107 = vfmadd213ps_fma(auVar62,auVar57,auVar178);
                  auVar148._8_4_ = 0x3c088908;
                  auVar148._0_8_ = 0x3c0889083c088908;
                  auVar148._12_4_ = 0x3c088908;
                  auVar148._16_4_ = 0x3c088908;
                  auVar148._20_4_ = 0x3c088908;
                  auVar148._24_4_ = 0x3c088908;
                  auVar148._28_4_ = 0x3c088908;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar57,auVar148);
                  auVar129._8_4_ = 0x3d2aa9c1;
                  auVar129._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar129._12_4_ = 0x3d2aa9c1;
                  auVar129._16_4_ = 0x3d2aa9c1;
                  auVar129._20_4_ = 0x3d2aa9c1;
                  auVar129._24_4_ = 0x3d2aa9c1;
                  auVar129._28_4_ = 0x3d2aa9c1;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar57,auVar129);
                  auVar58._8_4_ = 0x3e2aaaaa;
                  auVar58._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar58._12_4_ = 0x3e2aaaaa;
                  auVar58._16_4_ = 0x3e2aaaaa;
                  auVar58._20_4_ = 0x3e2aaaaa;
                  auVar58._24_4_ = 0x3e2aaaaa;
                  auVar58._28_4_ = 0x3e2aaaaa;
                  auVar96 = ZEXT1632(auVar161);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar96,auVar58);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar96,auVar142);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar25,auVar96);
                  auVar97._0_4_ = auVar107._0_4_ + fVar56;
                  auVar97._4_4_ = auVar107._4_4_ + fVar189;
                  auVar97._8_4_ = auVar107._8_4_ + fVar190;
                  auVar97._12_4_ = auVar107._12_4_ + fVar104;
                  auVar97._16_4_ = fVar21 + 0.0;
                  auVar97._20_4_ = fVar22 + 0.0;
                  auVar97._24_4_ = fVar23 + 0.0;
                  auVar97._28_4_ = fVar24 + 0.0;
                  auVar106._0_4_ = (int)auVar83._0_4_;
                  auVar106._4_4_ = (int)auVar83._4_4_;
                  auVar106._8_4_ = (int)auVar83._8_4_;
                  auVar106._12_4_ = (int)auVar83._12_4_;
                  auVar109._16_4_ = (int)auVar83._16_4_;
                  auVar109._0_16_ = auVar106;
                  auVar109._20_4_ = (int)auVar83._20_4_;
                  auVar109._24_4_ = (int)auVar83._24_4_;
                  auVar109._28_4_ = (int)auVar83._28_4_;
                  auVar161 = vpslld_avx(auVar106,0x17);
                  auVar107 = vpslld_avx(auVar109._16_16_,0x17);
                  auVar144._8_4_ = 0x3f800000;
                  auVar144._0_8_ = 0x3f8000003f800000;
                  auVar144._12_4_ = 0x3f800000;
                  auVar107 = vpaddd_avx(auVar144,auVar107);
                  auVar161 = vpaddd_avx(auVar161,auVar144);
                  auVar185._16_16_ = auVar107;
                  auVar185._0_16_ = auVar161;
                  auVar119 = vfmadd213ps_fma(auVar185,auVar97,auVar64);
                  auVar59._8_4_ = 0x800000;
                  auVar59._0_8_ = 0x80000000800000;
                  auVar59._12_4_ = 0x800000;
                  auVar59._16_4_ = 0x800000;
                  auVar59._20_4_ = 0x800000;
                  auVar59._24_4_ = 0x800000;
                  auVar59._28_4_ = 0x800000;
                  auVar83 = vmaxps_avx(ZEXT1632(auVar119),auVar59);
                  auVar161 = vpsrld_avx(auVar83._0_16_,0x17);
                  auVar107 = vpsrld_avx(auVar83._16_16_,0x17);
                  auVar60._8_4_ = 0x807fffff;
                  auVar60._0_8_ = 0x807fffff807fffff;
                  auVar60._12_4_ = 0x807fffff;
                  auVar60._16_4_ = 0x807fffff;
                  auVar60._20_4_ = 0x807fffff;
                  auVar60._24_4_ = 0x807fffff;
                  auVar60._28_4_ = 0x807fffff;
                  auVar83 = vandps_avx(auVar83,auVar60);
                  auVar96 = vorps_avx(auVar83,auVar142);
                  auVar61._8_4_ = 0x3f3504f3;
                  auVar61._0_8_ = 0x3f3504f33f3504f3;
                  auVar61._12_4_ = 0x3f3504f3;
                  auVar61._16_4_ = 0x3f3504f3;
                  auVar61._20_4_ = 0x3f3504f3;
                  auVar61._24_4_ = 0x3f3504f3;
                  auVar61._28_4_ = 0x3f3504f3;
                  auVar25 = vcmpps_avx(auVar61,auVar96,2);
                  auVar83 = vandnps_avx(auVar25,auVar96);
                  auVar98._0_4_ = auVar83._0_4_ + auVar96._0_4_ + -1.0;
                  auVar98._4_4_ = auVar83._4_4_ + auVar96._4_4_ + -1.0;
                  auVar98._8_4_ = auVar83._8_4_ + auVar96._8_4_ + -1.0;
                  auVar98._12_4_ = auVar83._12_4_ + auVar96._12_4_ + -1.0;
                  auVar98._16_4_ = auVar83._16_4_ + auVar96._16_4_ + -1.0;
                  auVar98._20_4_ = auVar83._20_4_ + auVar96._20_4_ + -1.0;
                  auVar98._24_4_ = auVar83._24_4_ + auVar96._24_4_ + -1.0;
                  auVar98._28_4_ = auVar83._28_4_ + auVar96._28_4_ + -1.0;
                  auVar107 = vpsubd_avx(auVar107,auVar25._16_16_);
                  auVar168._8_4_ = 0xffffff81;
                  auVar168._0_8_ = 0xffffff81ffffff81;
                  auVar168._12_4_ = 0xffffff81;
                  auVar107 = vpaddd_avx(auVar107,auVar168);
                  auVar161 = vpsubd_avx(auVar161,auVar25._0_16_);
                  auVar161 = vpaddd_avx(auVar168,auVar161);
                  auVar110._16_16_ = auVar107;
                  auVar110._0_16_ = auVar161;
                  auVar83._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                  auVar83._0_4_ = auVar98._0_4_ * auVar98._0_4_;
                  auVar83._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                  auVar83._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                  auVar83._16_4_ = auVar98._16_4_ * auVar98._16_4_;
                  auVar83._20_4_ = auVar98._20_4_ * auVar98._20_4_;
                  auVar83._24_4_ = auVar98._24_4_ * auVar98._24_4_;
                  auVar83._28_4_ = auVar25._28_4_;
                  auVar166._8_4_ = 0x3d9021bb;
                  auVar166._0_8_ = 0x3d9021bb3d9021bb;
                  auVar166._12_4_ = 0x3d9021bb;
                  auVar166._16_4_ = 0x3d9021bb;
                  auVar166._20_4_ = 0x3d9021bb;
                  auVar166._24_4_ = 0x3d9021bb;
                  auVar166._28_4_ = 0x3d9021bb;
                  auVar149._8_4_ = 0xbdebd1b8;
                  auVar149._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar149._12_4_ = 0xbdebd1b8;
                  auVar149._16_4_ = 0xbdebd1b8;
                  auVar149._20_4_ = 0xbdebd1b8;
                  auVar149._24_4_ = 0xbdebd1b8;
                  auVar149._28_4_ = 0xbdebd1b8;
                  auVar107 = vfmadd213ps_fma(auVar166,auVar98,auVar149);
                  auVar150._8_4_ = 0x3def251a;
                  auVar150._0_8_ = 0x3def251a3def251a;
                  auVar150._12_4_ = 0x3def251a;
                  auVar150._16_4_ = 0x3def251a;
                  auVar150._20_4_ = 0x3def251a;
                  auVar150._24_4_ = 0x3def251a;
                  auVar150._28_4_ = 0x3def251a;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar98,auVar150);
                  auVar151._8_4_ = 0xbdfe5d4f;
                  auVar151._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar151._12_4_ = 0xbdfe5d4f;
                  auVar151._16_4_ = 0xbdfe5d4f;
                  auVar151._20_4_ = 0xbdfe5d4f;
                  auVar151._24_4_ = 0xbdfe5d4f;
                  auVar151._28_4_ = 0xbdfe5d4f;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar98,auVar151);
                  auVar152._8_4_ = 0x3e11e9bf;
                  auVar152._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar152._12_4_ = 0x3e11e9bf;
                  auVar152._16_4_ = 0x3e11e9bf;
                  auVar152._20_4_ = 0x3e11e9bf;
                  auVar152._24_4_ = 0x3e11e9bf;
                  auVar152._28_4_ = 0x3e11e9bf;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar98,auVar152);
                  auVar153._8_4_ = 0xbe2aae50;
                  auVar153._0_8_ = 0xbe2aae50be2aae50;
                  auVar153._12_4_ = 0xbe2aae50;
                  auVar153._16_4_ = 0xbe2aae50;
                  auVar153._20_4_ = 0xbe2aae50;
                  auVar153._24_4_ = 0xbe2aae50;
                  auVar153._28_4_ = 0xbe2aae50;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar98,auVar153);
                  auVar154._8_4_ = 0x3e4cceac;
                  auVar154._0_8_ = 0x3e4cceac3e4cceac;
                  auVar154._12_4_ = 0x3e4cceac;
                  auVar154._16_4_ = 0x3e4cceac;
                  auVar154._20_4_ = 0x3e4cceac;
                  auVar154._24_4_ = 0x3e4cceac;
                  auVar154._28_4_ = 0x3e4cceac;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar98,auVar154);
                  auVar155._8_4_ = 0xbe7ffffc;
                  auVar155._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar155._12_4_ = 0xbe7ffffc;
                  auVar155._16_4_ = 0xbe7ffffc;
                  auVar155._20_4_ = 0xbe7ffffc;
                  auVar155._24_4_ = 0xbe7ffffc;
                  auVar155._28_4_ = 0xbe7ffffc;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar98,auVar155);
                  auVar156._8_4_ = 0x3eaaaaaa;
                  auVar156._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar156._12_4_ = 0x3eaaaaaa;
                  auVar156._16_4_ = 0x3eaaaaaa;
                  auVar156._20_4_ = 0x3eaaaaaa;
                  auVar156._24_4_ = 0x3eaaaaaa;
                  auVar156._28_4_ = 0x3eaaaaaa;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar98,auVar156);
                  auVar167._0_4_ = auVar98._0_4_ * auVar98._0_4_ * auVar98._0_4_ * auVar107._0_4_;
                  auVar167._4_4_ = auVar98._4_4_ * auVar98._4_4_ * auVar98._4_4_ * auVar107._4_4_;
                  auVar167._8_4_ = auVar98._8_4_ * auVar98._8_4_ * auVar98._8_4_ * auVar107._8_4_;
                  auVar167._12_4_ =
                       auVar98._12_4_ * auVar98._12_4_ * auVar98._12_4_ * auVar107._12_4_;
                  auVar167._16_4_ = auVar98._16_4_ * auVar98._16_4_ * auVar98._16_4_ * 0.0;
                  auVar167._20_4_ = auVar98._20_4_ * auVar98._20_4_ * auVar98._20_4_ * 0.0;
                  auVar167._24_4_ = auVar98._24_4_ * auVar98._24_4_ * auVar98._24_4_ * 0.0;
                  auVar167._28_4_ = 0;
                  auVar25 = vcvtdq2ps_avx(auVar110);
                  auVar171._8_4_ = 0xb95e8083;
                  auVar171._0_8_ = 0xb95e8083b95e8083;
                  auVar171._12_4_ = 0xb95e8083;
                  auVar171._16_4_ = 0xb95e8083;
                  auVar171._20_4_ = 0xb95e8083;
                  auVar171._24_4_ = 0xb95e8083;
                  auVar171._28_4_ = 0xb95e8083;
                  auVar107 = vfmadd231ps_fma(auVar167,auVar25,auVar171);
                  auVar107 = vfmsub231ps_fma(ZEXT1632(auVar107),auVar142,auVar83);
                  auVar83 = vcmpps_avx(ZEXT1632(auVar119),ZEXT832(0) << 0x20,2);
                  auVar96 = vsubps_avx(ZEXT1632(auVar107),auVar98);
                  auVar107 = vfmsub231ps_fma(auVar96,auVar143,auVar25);
                  auVar157._8_4_ = 0xc0000000;
                  auVar157._0_8_ = 0xc0000000c0000000;
                  auVar157._12_4_ = 0xc0000000;
                  auVar157._16_4_ = 0xc0000000;
                  auVar157._20_4_ = 0xc0000000;
                  auVar157._24_4_ = 0xc0000000;
                  auVar157._28_4_ = 0xc0000000;
                  auVar99._0_4_ = auVar107._0_4_ * -2.0;
                  auVar99._4_4_ = auVar107._4_4_ * -2.0;
                  auVar99._8_4_ = auVar107._8_4_ * -2.0;
                  auVar99._12_4_ = auVar107._12_4_ * -2.0;
                  auVar99._16_4_ = 0x80000000;
                  auVar99._20_4_ = 0x80000000;
                  auVar99._24_4_ = 0x80000000;
                  auVar99._28_4_ = 0;
                  auVar111._8_4_ = 0x7fffffff;
                  auVar111._0_8_ = 0x7fffffff7fffffff;
                  auVar111._12_4_ = 0x7fffffff;
                  auVar111._16_4_ = 0x7fffffff;
                  auVar111._20_4_ = 0x7fffffff;
                  auVar111._24_4_ = 0x7fffffff;
                  auVar111._28_4_ = 0x7fffffff;
                  auVar83 = vblendvps_avx(auVar99,auVar111,auVar83);
                  auVar83 = vminps_avx(auVar170,auVar83);
                  auVar174 = ZEXT3264(auVar79);
                  auVar79 = vmaxps_avx(auVar79,auVar83);
                  auVar176 = ZEXT3264(auVar117);
                  auVar107 = vfmadd213ps_fma(auVar117,auVar79,auVar142);
                  auVar117 = vroundps_avx(ZEXT1632(auVar107),1);
                  auVar83 = vcmpps_avx(ZEXT1632(auVar107),auVar117,1);
                  auVar83 = vandps_avx(auVar83,auVar64);
                  auVar83 = vsubps_avx(auVar117,auVar83);
                  auVar107 = vfmsub231ps_fma(auVar79,auVar83,auVar143);
                  auVar161 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar83,auVar171);
                  auVar79 = ZEXT1632(auVar161);
                  auVar96._28_4_ = auVar117._28_4_;
                  auVar96._0_28_ =
                       ZEXT1628(CONCAT412(auVar161._12_4_ * auVar161._12_4_,
                                          CONCAT48(auVar161._8_4_ * auVar161._8_4_,
                                                   CONCAT44(auVar161._4_4_ * auVar161._4_4_,
                                                            auVar161._0_4_ * auVar161._0_4_))));
                  auVar179 = ZEXT3264(auVar62);
                  auVar107 = vfmadd213ps_fma(auVar62,auVar79,auVar178);
                  auVar186._8_4_ = 0x3c088908;
                  auVar186._0_8_ = 0x3c0889083c088908;
                  auVar186._12_4_ = 0x3c088908;
                  auVar186._16_4_ = 0x3c088908;
                  auVar186._20_4_ = 0x3c088908;
                  auVar186._24_4_ = 0x3c088908;
                  auVar186._28_4_ = 0x3c088908;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar186);
                  auVar62._8_4_ = 0x3d2aa9c1;
                  auVar62._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar62._12_4_ = 0x3d2aa9c1;
                  auVar62._16_4_ = 0x3d2aa9c1;
                  auVar62._20_4_ = 0x3d2aa9c1;
                  auVar62._24_4_ = 0x3d2aa9c1;
                  auVar62._28_4_ = 0x3d2aa9c1;
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar62);
                  auVar63._8_4_ = 0x3e2aaaaa;
                  auVar63._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar63._12_4_ = 0x3e2aaaaa;
                  auVar63._16_4_ = 0x3e2aaaaa;
                  auVar63._20_4_ = 0x3e2aaaaa;
                  auVar63._24_4_ = 0x3e2aaaaa;
                  auVar63._28_4_ = 0x3e2aaaaa;
                  auVar79 = ZEXT1632(auVar161);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar63);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar79,auVar142);
                  auVar119 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar96,auVar79);
                  auVar131 = ZEXT3264(auVar64);
                  auVar85._0_4_ = (int)auVar83._0_4_;
                  auVar85._4_4_ = (int)auVar83._4_4_;
                  auVar85._8_4_ = (int)auVar83._8_4_;
                  auVar85._12_4_ = (int)auVar83._12_4_;
                  auVar100._16_4_ = (int)auVar83._16_4_;
                  auVar100._0_16_ = auVar85;
                  auVar100._20_4_ = (int)auVar83._20_4_;
                  auVar100._24_4_ = (int)auVar83._24_4_;
                  auVar100._28_4_ = (int)auVar83._28_4_;
                  auVar161 = vpslld_avx(auVar85,0x17);
                  auVar107 = vpslld_avx(auVar100._16_16_,0x17);
                  auVar118._8_4_ = 0x3f800000;
                  auVar118._0_8_ = 0x3f8000003f800000;
                  auVar118._12_4_ = 0x3f800000;
                  auVar107 = vpaddd_avx(auVar107,auVar118);
                  auVar161 = vpaddd_avx(auVar161,auVar118);
                  auVar101._16_16_ = auVar107;
                  auVar101._0_16_ = auVar161;
                  auVar112._0_4_ = auVar119._0_4_ + fVar56;
                  auVar112._4_4_ = auVar119._4_4_ + fVar189;
                  auVar112._8_4_ = auVar119._8_4_ + fVar190;
                  auVar112._12_4_ = auVar119._12_4_ + fVar104;
                  auVar112._16_4_ = fVar21 + 0.0;
                  auVar112._20_4_ = fVar22 + 0.0;
                  auVar112._24_4_ = fVar23 + 0.0;
                  auVar112._28_4_ = fVar24 + 0.0;
                  auVar107 = vfmadd213ps_fma(auVar101,auVar112,auVar64);
                  auVar83 = vdivps_avx(auVar64,ZEXT1632(auVar107));
                  auVar64._8_4_ = 0xbf800000;
                  auVar64._0_8_ = 0xbf800000bf800000;
                  auVar64._12_4_ = 0xbf800000;
                  auVar64._16_4_ = 0xbf800000;
                  auVar64._20_4_ = 0xbf800000;
                  auVar64._24_4_ = 0xbf800000;
                  auVar64._28_4_ = 0xbf800000;
                  auVar107 = vfnmadd213ps_fma(auVar83,auVar157,auVar64);
                  auVar95 = ZEXT1628(auVar107);
                  goto LAB_004428cd;
                case 6:
                  puVar18 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar18;
                  auVar79._4_4_ = uVar1;
                  auVar79._0_4_ = uVar1;
                  auVar79._8_4_ = uVar1;
                  auVar79._12_4_ = uVar1;
                  auVar79._16_4_ = uVar1;
                  auVar79._20_4_ = uVar1;
                  auVar79._24_4_ = uVar1;
                  auVar79._28_4_ = uVar1;
                  uVar1 = puVar18[1];
                  auVar117._4_4_ = uVar1;
                  auVar117._0_4_ = uVar1;
                  auVar117._8_4_ = uVar1;
                  auVar117._12_4_ = uVar1;
                  auVar117._16_4_ = uVar1;
                  auVar117._20_4_ = uVar1;
                  auVar117._24_4_ = uVar1;
                  auVar117._28_4_ = uVar1;
                  auVar107 = vfmadd231ps_fma(auVar117,auVar83,auVar79);
                  auVar83 = vmaxps_avx(ZEXT1632(auVar107),_DAT_005b5560);
                  auVar83 = vminps_avx(auVar83,auVar64);
                  auVar95 = auVar83._0_28_;
LAB_004428cd:
                  auVar160._0_4_ = auVar95._0_4_ * auVar84._0_4_;
                  auVar160._4_4_ = auVar95._4_4_ * auVar84._4_4_;
                  auVar160._8_4_ = auVar95._8_4_ * auVar84._8_4_;
                  auVar160._12_4_ = auVar95._12_4_ * auVar84._12_4_;
                  auVar160._16_4_ = auVar95._16_4_ * auVar84._16_4_;
                  auVar160._20_4_ = auVar95._20_4_ * auVar84._20_4_;
                  auVar160._24_4_ = auVar95._24_4_ * auVar84._24_4_;
                  auVar83 = auVar160._0_32_;
                }
                *pauVar46 = auVar83;
                pauVar46 = pauVar46 + 1;
                iVar31 = iVar31 + 1;
                iVar44 = iVar44 + 1;
              } while (iVar31 != _w);
            }
            iVar35 = iVar35 + 1;
          } while (iVar35 != iVar42);
        }
        local_2c8 = local_2c8 + 1;
        local_1e8 = (void *)CONCAT44(local_1e8._4_4_,uVar7);
      } while (local_2c8 != uVar40);
    }
  }
  else {
    uVar36 = (int)(iVar43 * uVar36) / iVar29;
    uVar37 = iVar38 / iVar29;
    local_298 = 1;
    local_2d8 = 1;
    if (opt->use_packing_layout == true) {
      local_298 = (uint)((uVar36 & 3) == 0) * 3 + 1;
      if ((uVar36 & 7) == 0) {
        local_298 = 8;
      }
      local_2d8 = (uint)((uVar37 & 3) == 0) * 3 + 1;
      if ((uVar37 & 7) == 0) {
        local_2d8 = 8;
      }
    }
    piVar15 = bottom_blob->refcount;
    local_178.data = bottom_blob->data;
    local_178.refcount = bottom_blob->refcount;
    local_178.elemsize = bottom_blob->elemsize;
    local_178.elempack = bottom_blob->elempack;
    local_178.allocator = bottom_blob->allocator;
    local_178.dims = bottom_blob->dims;
    local_178.w = bottom_blob->w;
    local_178.h = bottom_blob->h;
    local_178.d = bottom_blob->d;
    local_178.c = bottom_blob->c;
    local_178.cstep = bottom_blob->cstep;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    if (local_298 < iVar43) {
      local_1c8.data = *(void **)opt;
      local_1c8.elemsize = (size_t)opt->workspace_allocator;
      local_1c8.elempack = opt->openmp_blocktime;
      local_1c8._28_1_ = opt->use_winograd_convolution;
      local_1c8._29_1_ = opt->use_sgemm_convolution;
      local_1c8._30_1_ = opt->use_int8_inference;
      local_1c8._31_1_ = opt->use_vulkan_compute;
      local_1c8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1c8._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_1c8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1c8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1c8.refcount = (int *)opt->workspace_allocator;
      convert_packing(bottom_blob,&local_178,local_298,(Option *)&local_1c8);
      if (local_178.data == (void *)0x0) {
        iVar38 = -100;
        bVar27 = false;
      }
      else {
        if ((long)local_178.c * local_178.cstep != 0) goto LAB_00442a7e;
        bVar27 = false;
        iVar38 = -100;
      }
    }
    else {
LAB_00442a7e:
      piVar15 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      local_1c8.refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      local_1c8.data = local_238.data;
      local_1c8.elemsize = local_238.elemsize;
      local_1c8.elempack = local_238.elempack;
      local_1c8.allocator = local_238.allocator;
      local_1c8.w = local_238.w;
      local_1c8.dims = local_238.dims;
      local_1c8.h = local_238.h;
      local_1c8.d = local_238.d;
      local_1c8.c = local_238.c;
      local_1c8.cstep = local_238.cstep;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      if (local_2d8 < uVar30) {
        Mat::create(&local_1c8,_w,iVar42,
                    (this->super_DeconvolutionDepthWise).num_output / (int)local_2d8,
                    (ulong)local_2d8 * (sVar53 / uVar30),local_2d8,opt->workspace_allocator);
        iVar38 = -100;
        if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0))
        goto LAB_00442b7d;
LAB_00442e73:
        bVar27 = false;
      }
      else {
LAB_00442b7d:
        if (0 < (this->super_DeconvolutionDepthWise).group) {
          local_1e8._0_4_ = (int)uVar36 / local_298;
          iVar42 = 0;
          iVar43 = 0;
          lVar51 = 0;
          do {
            local_c0 = (void *)((long)(iVar42 / local_298) * local_178.cstep * local_178.elemsize +
                               (long)local_178.data);
            local_b8 = (int *)0x0;
            local_b0 = local_178.elemsize;
            local_a8 = local_178.elempack;
            local_a0 = local_178.allocator;
            local_88 = (int)local_1e8;
            local_80 = ((long)local_178.d * local_178.elemsize *
                        (long)local_178.h * (long)local_178.w + 0xf & 0xfffffffffffffff0) /
                       local_178.elemsize;
            local_98 = local_178.dims;
            iStack_94 = local_178.w;
            iStack_90 = local_178.h;
            iStack_8c = local_178.d;
            local_108 = (void *)((long)(iVar43 / (int)local_2d8) * local_1c8.cstep *
                                 local_1c8.elemsize + (long)local_1c8.data);
            local_100 = (int *)0x0;
            local_f8 = (Allocator *)local_1c8.elemsize;
            local_f0 = local_1c8.elempack;
            local_e8 = local_1c8.allocator;
            local_c8 = ((long)local_1c8.d * local_1c8.elemsize *
                        (long)local_1c8.h * (long)local_1c8.w + 0xf & 0xfffffffffffffff0) /
                       local_1c8.elemsize;
            local_e0 = local_1c8.dims;
            iStack_dc = local_1c8.w;
            iStack_d8 = local_1c8.h;
            iStack_d4 = local_1c8.d;
            pLVar19 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar51];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = local_1c8.allocator;
            local_d0 = (int)uVar37 / (int)local_2d8;
            iVar38 = (*pLVar19->_vptr_Layer[7])(pLVar19,&local_c0,&local_108,&local_78);
            if (local_100 != (int *)0x0) {
              LOCK();
              *local_100 = *local_100 + -1;
              UNLOCK();
              if (*local_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            if (local_b8 != (int *)0x0) {
              LOCK();
              *local_b8 = *local_b8 + -1;
              UNLOCK();
              if (*local_b8 == 0) {
                if (local_a0 == (Allocator *)0x0) {
                  if (local_c0 != (void *)0x0) {
                    free(local_c0);
                  }
                }
                else {
                  (*local_a0->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar38 != 0) goto LAB_00442e73;
            lVar51 = lVar51 + 1;
            iVar43 = iVar43 + uVar37;
            iVar42 = iVar42 + uVar36;
          } while (lVar51 < (this->super_DeconvolutionDepthWise).group);
        }
        if (local_2d8 < uVar30) {
          convert_packing(&local_1c8,&local_238,uVar30,opt);
          iVar38 = -100;
          if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
          goto LAB_00442e73;
        }
        else {
          if ((Allocator *)local_1c8.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_1c8.refcount =
                 *(int *)(_func_int ***)local_1c8.refcount + 1;
            UNLOCK();
          }
          piVar15 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + -1;
            UNLOCK();
            if (*piVar15 == 0) {
              if (local_238.allocator == (Allocator *)0x0) {
                if (local_238.data != (void *)0x0) {
                  free(local_238.data);
                }
              }
              else {
                (*(local_238.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_238.data = local_1c8.data;
          local_238.refcount._0_4_ = SUB84(local_1c8.refcount,0);
          local_238.refcount._4_4_ = (undefined4)((ulong)local_1c8.refcount >> 0x20);
          local_238.elemsize = local_1c8.elemsize;
          local_238.elempack = local_1c8.elempack;
          local_238.allocator = local_1c8.allocator;
          local_238.dims = local_1c8.dims;
          local_238.w = local_1c8.w;
          local_238.h = local_1c8.h;
          local_238.d = local_1c8.d;
          local_238.c = local_1c8.c;
          local_238.cstep = local_1c8.cstep;
        }
        iVar38 = -100;
        bVar27 = true;
      }
      if ((Allocator *)local_1c8.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_1c8.refcount = *(int *)(_func_int ***)local_1c8.refcount + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_1c8.refcount == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            if (local_1c8.data != (void *)0x0) {
              free(local_1c8.data);
            }
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_178.refcount != (int *)0x0) {
      LOCK();
      *local_178.refcount = *local_178.refcount + -1;
      UNLOCK();
      if (*local_178.refcount == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar27) goto LAB_00443b4e;
  }
  pMVar28 = local_180;
  DeconvolutionDepthWise::cut_padding(&this->super_DeconvolutionDepthWise,&local_238,local_180,opt);
  if ((pMVar28->data == (void *)0x0) || (iVar38 = 0, (long)local_180->c * local_180->cstep == 0)) {
    iVar38 = -100;
  }
LAB_00443b4e:
  piVar15 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar38;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}